

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locresdata.cpp
# Opt level: O0

UChar * uloc_getTableStringWithFallback_63
                  (char *path,char *locale,char *tableKey,char *subTableKey,char *itemKey,
                  int32_t *pLength,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int iVar2;
  UChar *us;
  UChar *fallbackLocale;
  char *pcStack_290;
  int32_t len;
  char *replacement;
  char explicitFallbackName [157];
  UChar *pUStack_1e0;
  UErrorCode errorCode;
  UChar *item;
  UResourceBundle subTable;
  UResourceBundle table;
  UResourceBundle *rb;
  int32_t *pLength_local;
  char *itemKey_local;
  char *subTableKey_local;
  char *tableKey_local;
  char *locale_local;
  char *path_local;
  
  pUStack_1e0 = (UChar *)0x0;
  memset(&replacement,0,0x9d);
  stack0xfffffffffffffe1c = U_ZERO_ERROR;
  table._192_8_ = ures_open_63(path,locale,(UErrorCode *)(explicitFallbackName + 0x9c));
  UVar1 = U_FAILURE(stack0xfffffffffffffe1c);
  if (UVar1 == '\0') {
    if ((stack0xfffffffffffffe1c == U_USING_DEFAULT_WARNING) ||
       ((stack0xfffffffffffffe1c == U_ERROR_WARNING_START &&
        (*pErrorCode != U_USING_DEFAULT_WARNING)))) {
      *pErrorCode = stack0xfffffffffffffe1c;
    }
    do {
      ures_initStackObject_63((UResourceBundle *)&subTable.fSize);
      ures_initStackObject_63((UResourceBundle *)&item);
      ures_getByKeyWithFallback_63
                ((UResourceBundle *)table._192_8_,tableKey,(UResourceBundle *)&subTable.fSize,
                 (UErrorCode *)(explicitFallbackName + 0x9c));
      if (subTableKey != (char *)0x0) {
        ures_getByKeyWithFallback_63
                  ((UResourceBundle *)&subTable.fSize,subTableKey,(UResourceBundle *)&subTable.fSize
                   ,(UErrorCode *)(explicitFallbackName + 0x9c));
      }
      UVar1 = U_SUCCESS(stack0xfffffffffffffe1c);
      if (UVar1 != '\0') {
        pUStack_1e0 = ures_getStringByKeyWithFallback_63
                                ((UResourceBundle *)&subTable.fSize,itemKey,pLength,
                                 (UErrorCode *)(explicitFallbackName + 0x9c));
        UVar1 = U_FAILURE(stack0xfffffffffffffe1c);
        if (UVar1 == '\0') goto LAB_00335ace;
        pcStack_290 = (char *)0x0;
        *pErrorCode = stack0xfffffffffffffe1c;
        stack0xfffffffffffffe1c = U_ZERO_ERROR;
        iVar2 = strcmp(tableKey,"Countries");
        if (iVar2 == 0) {
          pcStack_290 = uloc_getCurrentCountryID_63(itemKey);
        }
        else {
          iVar2 = strcmp(tableKey,"Languages");
          if (iVar2 == 0) {
            pcStack_290 = uloc_getCurrentLanguageID_63(itemKey);
          }
        }
        if ((pcStack_290 != (char *)0x0) && (itemKey != pcStack_290)) {
          pUStack_1e0 = ures_getStringByKeyWithFallback_63
                                  ((UResourceBundle *)&subTable.fSize,pcStack_290,pLength,
                                   (UErrorCode *)(explicitFallbackName + 0x9c));
          UVar1 = U_SUCCESS(stack0xfffffffffffffe1c);
          if (UVar1 != '\0') {
            *pErrorCode = stack0xfffffffffffffe1c;
            goto LAB_00335ace;
          }
        }
      }
      UVar1 = U_FAILURE(stack0xfffffffffffffe1c);
      if (UVar1 == '\0') goto LAB_00335ace;
      fallbackLocale._4_4_ = 0;
      *pErrorCode = stack0xfffffffffffffe1c;
      stack0xfffffffffffffe1c = U_ZERO_ERROR;
      us = ures_getStringByKeyWithFallback_63
                     ((UResourceBundle *)&subTable.fSize,"Fallback",
                      (int32_t *)((long)&fallbackLocale + 4),
                      (UErrorCode *)(explicitFallbackName + 0x9c));
      UVar1 = U_FAILURE(stack0xfffffffffffffe1c);
      if (UVar1 != '\0') {
        *pErrorCode = stack0xfffffffffffffe1c;
        goto LAB_00335ace;
      }
      u_UCharsToChars_63(us,(char *)&replacement,fallbackLocale._4_4_);
      iVar2 = strcmp((char *)&replacement,locale);
      if (iVar2 == 0) {
        *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
        goto LAB_00335ace;
      }
      ures_close_63((UResourceBundle *)table._192_8_);
      table._192_8_ =
           ures_open_63(path,(char *)&replacement,(UErrorCode *)(explicitFallbackName + 0x9c));
      UVar1 = U_FAILURE(stack0xfffffffffffffe1c);
    } while (UVar1 == '\0');
    *pErrorCode = stack0xfffffffffffffe1c;
LAB_00335ace:
    ures_close_63((UResourceBundle *)&item);
    ures_close_63((UResourceBundle *)&subTable.fSize);
    ures_close_63((UResourceBundle *)table._192_8_);
    path_local = (char *)pUStack_1e0;
  }
  else {
    *pErrorCode = stack0xfffffffffffffe1c;
    path_local = (char *)0x0;
  }
  return (UChar *)path_local;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
uloc_getTableStringWithFallback(const char *path, const char *locale,
                              const char *tableKey, const char *subTableKey,
                              const char *itemKey,
                              int32_t *pLength,
                              UErrorCode *pErrorCode)
{
/*    char localeBuffer[ULOC_FULLNAME_CAPACITY*4];*/
    UResourceBundle *rb=NULL, table, subTable;
    const UChar *item=NULL;
    UErrorCode errorCode;
    char explicitFallbackName[ULOC_FULLNAME_CAPACITY] = {0};

    /*
     * open the bundle for the current locale
     * this falls back through the locale's chain to root
     */
    errorCode=U_ZERO_ERROR;
    rb=ures_open(path, locale, &errorCode);

    if(U_FAILURE(errorCode)) {
        /* total failure, not even root could be opened */
        *pErrorCode=errorCode;
        return NULL;
    } else if(errorCode==U_USING_DEFAULT_WARNING ||
                (errorCode==U_USING_FALLBACK_WARNING && *pErrorCode!=U_USING_DEFAULT_WARNING)
    ) {
        /* set the "strongest" error code (success->fallback->default->failure) */
        *pErrorCode=errorCode;
    }

    for(;;){
        ures_initStackObject(&table);
        ures_initStackObject(&subTable);
        ures_getByKeyWithFallback(rb, tableKey, &table, &errorCode);

        if (subTableKey != NULL) {
            /*
            ures_getByKeyWithFallback(&table,subTableKey, &subTable, &errorCode);
            item = ures_getStringByKeyWithFallback(&subTable, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
            }
            
            break;*/
            
            ures_getByKeyWithFallback(&table,subTableKey, &table, &errorCode);
        }
        if(U_SUCCESS(errorCode)){
            item = ures_getStringByKeyWithFallback(&table, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                const char* replacement = NULL;
                *pErrorCode = errorCode; /*save the errorCode*/
                errorCode = U_ZERO_ERROR;
                /* may be a deprecated code */
                if(uprv_strcmp(tableKey, "Countries")==0){
                    replacement =  uloc_getCurrentCountryID(itemKey);
                }else if(uprv_strcmp(tableKey, "Languages")==0){
                    replacement =  uloc_getCurrentLanguageID(itemKey);
                }
                /*pointer comparison is ok since uloc_getCurrentCountryID & uloc_getCurrentLanguageID return the key itself is replacement is not found*/
                if(replacement!=NULL && itemKey != replacement){
                    item = ures_getStringByKeyWithFallback(&table, replacement, pLength, &errorCode);
                    if(U_SUCCESS(errorCode)){
                        *pErrorCode = errorCode;
                        break;
                    }
                }
            }else{
                break;
            }
        }
        
        if(U_FAILURE(errorCode)){    

            /* still can't figure out ?.. try the fallback mechanism */
            int32_t len = 0;
            const UChar* fallbackLocale =  NULL;
            *pErrorCode = errorCode;
            errorCode = U_ZERO_ERROR;

            fallbackLocale = ures_getStringByKeyWithFallback(&table, "Fallback", &len, &errorCode);
            if(U_FAILURE(errorCode)){
               *pErrorCode = errorCode;
                break;
            }
            
            u_UCharsToChars(fallbackLocale, explicitFallbackName, len);
            
            /* guard against recursive fallback */
            if(uprv_strcmp(explicitFallbackName, locale)==0){
                *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
                break;
            }
            ures_close(rb);
            rb = ures_open(path, explicitFallbackName, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
                break;
            }
            /* succeeded in opening the fallback bundle .. continue and try to fetch the item */
        }else{
            break;
        }
    }
    /* done with the locale string - ready to close table and rb */
    ures_close(&subTable);
    ures_close(&table);
    ures_close(rb);
    return item;
}